

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::anon_unknown_7::LineBufferTaskIIF::getWritePointer<half>
          (LineBufferTaskIIF *this,int y,unsigned_short **outWritePointerRight,
          size_t *outPixelsToCopySSE,size_t *outPixelsToCopyNormal,int channelBank)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  pointer psVar7;
  ulong uVar8;
  
  psVar7 = (this->_ifd->optimizationData).
           super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->_ifd->optimizationData).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 3) *
          0x6db6db6db6db6db7;
  uVar5 = 0;
  if (channelBank == 1) {
    uVar5 = uVar8 >> 1;
  }
  uVar3 = psVar7[uVar5].ySampling;
  if (y < 0) {
    if (-1 < (int)uVar3) {
      uVar2 = (~y + uVar3) / uVar3;
      goto LAB_004610c8;
    }
    uVar2 = (~uVar3 - y) / -uVar3;
  }
  else if ((int)uVar3 < 0) {
    uVar2 = (uint)y / -uVar3;
LAB_004610c8:
    uVar2 = -uVar2;
  }
  else {
    uVar2 = (uint)y / uVar3;
  }
  psVar7 = psVar7 + uVar5;
  if (uVar2 * uVar3 != y) {
    *outPixelsToCopySSE = 0;
    *outPixelsToCopyNormal = 0;
    *outWritePointerRight = (unsigned_short *)0x0;
  }
  if (y < 0) {
    if (-1 < (int)uVar3) {
      y = ~y + uVar3;
      goto LAB_00461114;
    }
    uVar3 = (~uVar3 - y) / -uVar3;
  }
  else if ((int)uVar3 < 0) {
    uVar3 = -uVar3;
LAB_00461114:
    uVar3 = -((uint)y / uVar3);
  }
  else {
    uVar3 = (uint)y / uVar3;
  }
  uVar2 = this->_ifd->minX;
  uVar6 = psVar7->xSampling;
  if ((int)uVar2 < 0) {
    if (-1 < (int)uVar6) {
      uVar2 = (~uVar2 + uVar6) / uVar6;
      goto LAB_0046116c;
    }
    uVar2 = (~uVar6 - uVar2) / -uVar6;
  }
  else if ((int)uVar6 < 0) {
    uVar2 = uVar2 / -uVar6;
LAB_0046116c:
    uVar2 = -uVar2;
  }
  else {
    uVar2 = uVar2 / uVar6;
  }
  uVar4 = this->_ifd->maxX;
  if ((int)uVar4 < 0) {
    if ((int)uVar6 < 0) {
      uVar4 = (~uVar6 - uVar4) / -uVar6;
      goto LAB_004611c1;
    }
    uVar4 = ~uVar4 + uVar6;
  }
  else {
    if (-1 < (int)uVar6) {
      uVar4 = uVar4 / uVar6;
      goto LAB_004611c1;
    }
    uVar6 = -uVar6;
  }
  uVar4 = -(uVar4 / uVar6);
LAB_004611c1:
  uVar5 = uVar8 >> 1;
  if (uVar8 < 5) {
    uVar5 = uVar8;
  }
  sVar1 = psVar7->xStride;
  *outWritePointerRight =
       (unsigned_short *)
       (psVar7->base + sVar1 * (long)(int)uVar2 + psVar7->yStride * (long)(int)uVar3);
  uVar5 = (((long)(int)uVar4 - (long)(int)uVar2) * sVar1 + 2 >> 1) / uVar5 + 1;
  *outPixelsToCopySSE = uVar5 >> 3;
  *outPixelsToCopyNormal = (ulong)((uint)uVar5 & 7);
  return;
}

Assistant:

void LineBufferTaskIIF::getWritePointer 
                            (int y,
                             unsigned short*& outWritePointerRight,
                             size_t& outPixelsToCopySSE,
                             size_t& outPixelsToCopyNormal,
                             int channelBank
                            ) const
{
      // Channels are saved alphabetically, so the order is B G R.
      // The last slice (R) will give us the location of our write pointer.
      // The only slice that we support skipping is alpha, i.e. the first one.  
      // This does not impact the write pointer or the pixels to copy at all.
      
      size_t nbSlicesInBank = _ifd->optimizationData.size();
      
      int sizeOfSingleValue = sizeof(TYPE);
      
      if(_ifd->optimizationData.size()>4)
      {
          // there are two banks - we only copy one at once
          nbSlicesInBank/=2;
      }

      
      size_t firstChannel = 0;
      if(channelBank==1)
      {
          firstChannel = _ifd->optimizationData.size()/2;
      }
      
       sliceOptimizationData& firstSlice = _ifd->optimizationData[firstChannel];
      
      if (modp (y, firstSlice.ySampling) != 0)
      {
          outPixelsToCopySSE    = 0;
          outPixelsToCopyNormal = 0;
          outWritePointerRight  = 0;
      }
      
      const char* linePtr1  = firstSlice.base +
      divp (y, firstSlice.ySampling) *
      firstSlice.yStride;
      
      int dMinX1 = divp (_ifd->minX, firstSlice.xSampling);
      int dMaxX1 = divp (_ifd->maxX, firstSlice.xSampling);
      
      // Construct the writePtr so that we start writing at
      // linePtr + Min offset in the line.
      outWritePointerRight =  (unsigned short*)(linePtr1 +
      dMinX1 * firstSlice.xStride );
      
      size_t bytesToCopy  = ((linePtr1 + dMaxX1 * firstSlice.xStride ) -
      (linePtr1 + dMinX1 * firstSlice.xStride )) + 2;
      size_t shortsToCopy = bytesToCopy / sizeOfSingleValue;
      size_t pixelsToCopy = (shortsToCopy / nbSlicesInBank ) + 1;
      
      // We only support writing to SSE if we have no pixels to copy normally
      outPixelsToCopySSE    = pixelsToCopy / 8;
      outPixelsToCopyNormal = pixelsToCopy % 8;
      
}